

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

bool __thiscall LinkedObjectFile::label_points_to_code(LinkedObjectFile *this,int label_id)

{
  const_reference pvVar1;
  const_reference pvVar2;
  
  pvVar1 = std::vector<Label,_std::allocator<Label>_>::at(&this->labels,(long)label_id);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&this->offset_of_data_zone_by_seg,(long)pvVar1->target_segment);
  return pvVar1->offset < (int)(*pvVar2 * 4);
}

Assistant:

bool LinkedObjectFile::label_points_to_code(int label_id) const {
  auto& label = labels.at(label_id);
  auto data_start = int(offset_of_data_zone_by_seg.at(label.target_segment)) * 4;
  return label.offset < data_start;
}